

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
  *this_00;
  Lazy *pLVar1;
  aiNode *paVar2;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  size_t i_1;
  uint uVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  uint8_t *puVar11;
  MemoryIOStream *__p;
  LazyObject *pLVar12;
  IfcUnitAssignment *pIVar13;
  IfcRepresentationContext *pIVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  IfcGeometricRepresentationContext *pIVar16;
  const_iterator cVar17;
  aiNode *paVar18;
  IfcRelAggregates *pIVar19;
  IfcObjectDefinition *pIVar20;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var21;
  IFCImporter *pIVar22;
  _Base_ptr p_Var23;
  aiMesh **__s;
  aiMaterial **__s_00;
  void *pvVar24;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *in_R8;
  uLong uVar25;
  aiScene *paVar26;
  Lazy *pLVar27;
  _Base_ptr p_Var28;
  size_t i;
  uLong __size;
  ulong uVar29;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar30;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_500;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  aiScene *local_4e8;
  IFCImporter *local_4e0;
  string fileName;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  shared_ptr<Assimp::IOStream> stream;
  aiMatrix4x4t<float> temp_1;
  char filename [256];
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  Settings *local_2d8;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_2d0;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_2c8;
  _Rb_tree_node_base local_2b8;
  size_t local_298;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_288;
  unz_file_info fileInfo;
  aiMatrix4x4t<float> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  aiMatrix4x4t<float> local_a0;
  ConversionSchema schema;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)filename,"rb",(allocator<char> *)&fileInfo);
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,filename._0_8_);
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&stream,
             (IOStream *)CONCAT44(extraout_var,iVar7));
  std::__cxx11::string::~string((string *)filename);
  if (stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)filename,"Could not open file for reading",(allocator<char> *)&fileInfo);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)filename);
    std::__cxx11::string::~string((string *)filename);
  }
  BaseImporter::GetExtension((string *)filename,pFile);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          filename,"ifczip");
  std::__cxx11::string::~string((string *)filename);
  local_4e8 = pScene;
  if (bVar6) {
    lVar9 = unzOpen((pFile->_M_dataplus)._M_p);
    if (lVar9 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filename,"Could not open ifczip file for reading, unzip failed",
                 (allocator<char> *)&fileInfo);
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)filename);
      std::__cxx11::string::~string((string *)filename);
    }
    std::__cxx11::string::substr((ulong)&fileName,(ulong)pFile);
    lVar10 = std::__cxx11::string::rfind((char)pFile,0x5c);
    if (lVar10 == -1) {
      lVar10 = std::__cxx11::string::rfind((char)pFile,0x2f);
      if (lVar10 != -1) goto LAB_00426eeb;
    }
    else {
LAB_00426eeb:
      std::__cxx11::string::substr((ulong)filename,(ulong)&fileName);
      std::__cxx11::string::operator=((string *)&fileName,(string *)filename);
      std::__cxx11::string::~string((string *)filename);
    }
    iVar7 = unzGoToFirstFile(lVar9);
    if (iVar7 == 0) {
      local_4e0 = this;
      do {
        in_R8 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
        unzGetCurrentFileInfo(lVar9,&fileInfo,filename,0x100,0,0,0,0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp,filename,(allocator<char> *)&local_a0);
        BaseImporter::GetExtension((string *)&temp_1,(string *)&temp);
        bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&temp_1,"ifc");
        std::__cxx11::string::~string((string *)&temp_1);
        std::__cxx11::string::~string((string *)&temp);
      } while (bVar6);
      puVar11 = (uint8_t *)operator_new__(fileInfo.uncompressed_size);
      LogFunctions<Assimp::IFCImporter>::LogInfo((char *)0x42701d);
      unzOpenCurrentFile(lVar9);
      uVar25 = 0;
      do {
        __size = fileInfo.uncompressed_size;
        if (0x7ffe < fileInfo.uncompressed_size) {
          __size = 0x7fff;
        }
        pvVar24 = malloc(__size);
        uVar8 = unzReadCurrentFile(lVar9,pvVar24,__size & 0xffffffff);
        if (0 < (int)uVar8) {
          memcpy(puVar11 + uVar25,pvVar24,(ulong)uVar8);
          uVar25 = uVar25 + uVar8;
        }
        free(pvVar24);
        pScene = local_4e8;
      } while (0 < (int)uVar8);
      if ((uVar25 == 0) || (uVar25 != fileInfo.uncompressed_size)) {
        operator_delete__(puVar11);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp_1,"Failed to decompress IFC ZIP file",(allocator<char> *)&temp);
        LogFunctions<Assimp::IFCImporter>::ThrowException((string *)&temp_1);
        std::__cxx11::string::~string((string *)&temp_1);
      }
      unzCloseCurrentFile(lVar9);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00729b60;
      __p->buffer = puVar11;
      __p->length = fileInfo.uncompressed_size;
      __p->pos = 0;
      __p->own = true;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>,__p);
      this = local_4e0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filename,"Found no IFC file member in IFCZIP file (2)",
                 (allocator<char> *)&fileInfo);
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)filename);
      std::__cxx11::string::~string((string *)filename);
    }
    unzClose(lVar9);
    std::__cxx11::string::~string((string *)&fileName);
  }
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_288,&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>,_true,_true>)
       STEP::ReadFileHeader((shared_ptr<Assimp::IOStream> *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
  uVar3._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl =
       db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
       super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl;
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)db._M_t.
                   super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                   .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x40);
  if (*(long *)((long)db._M_t.
                      super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                      .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x48) != 0) {
    std::__cxx11::string::substr((ulong)filename,(ulong)pbVar15);
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            filename,"IFC");
    std::__cxx11::string::~string((string *)filename);
    if (!bVar6) goto LAB_004271dc;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename,
                 "Unrecognized file schema: ",pbVar15);
  LogFunctions<Assimp::IFCImporter>::ThrowException((string *)filename);
  std::__cxx11::string::~string((string *)filename);
LAB_004271dc:
  bVar6 = DefaultLogger::isNullLogger();
  if (!bVar6) {
    std::operator+(&fileName,"File schema is \'",pbVar15);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo,
                   &fileName,'\'');
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)filename);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)filename);
    std::__cxx11::string::~string((string *)&fileInfo);
    std::__cxx11::string::~string((string *)&fileName);
    if (*(long *)((long)uVar3._M_t.
                        super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                        .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 8) != 0) {
      std::operator+(&fileName,"Timestamp \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     uVar3._M_t.
                     super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                     .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo,
                     &fileName,'\'');
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)filename);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)filename);
      std::__cxx11::string::~string((string *)&fileInfo);
      std::__cxx11::string::~string((string *)&fileName);
    }
    if (*(long *)((long)uVar3._M_t.
                        super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                        .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x28) != 0)
    {
      std::operator+(&fileName,"Application/Exporter identline is \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)uVar3._M_t.
                            super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                            .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo,
                     &fileName,'\'');
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileInfo);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)filename);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)filename);
      std::__cxx11::string::~string((string *)&fileInfo);
      std::__cxx11::string::~string((string *)&fileName);
    }
  }
  schema.converters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &schema.converters._M_t._M_impl.super__Rb_tree_header._M_header;
  schema.converters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  schema.converters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  schema.converters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  schema.converters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       schema.converters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Assimp::IFC::Schema_2x3::GetSchema(&schema);
  STEP::ReadFile<3ul,6ul>
            ((DB *)db._M_t.
                   super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                   .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl,&schema,
             &InternReadFile::types_to_track,&InternReadFile::inverse_indices_to_track);
  uVar3 = db;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)filename,"ifcproject",(allocator<char> *)&fileInfo);
  pLVar12 = STEP::DB::GetObject((DB *)uVar3._M_t.
                                      super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                                      .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl
                                ,(string *)filename);
  std::__cxx11::string::~string((string *)filename);
  if (pLVar12 == (LazyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)filename,"missing IfcProject entity",(allocator<char> *)&fileInfo);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)filename);
    std::__cxx11::string::~string((string *)filename);
  }
  uVar3._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl =
       db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
       super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl;
  filename._32_8_ = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(pLVar12);
  filename[0] = '\0';
  filename[1] = '\0';
  filename[2] = '\0';
  filename[3] = '\0';
  filename[4] = '\0';
  filename[5] = '\0';
  filename[6] = -0x10;
  filename[7] = '?';
  filename[8] = '\0';
  filename[9] = '\0';
  filename[10] = '\0';
  filename[0xb] = '\0';
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = -0x10;
  filename[0xf] = -0x41;
  filename._24_8_ =
       uVar3._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>.
       _M_t.super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
       super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl;
  filename[0x30] = '\0';
  filename[0x31] = '\0';
  filename[0x32] = '\0';
  filename[0x33] = '\0';
  filename[0x34] = '\0';
  filename[0x35] = '\0';
  filename[0x36] = -0x10;
  filename[0x37] = '?';
  filename[0x38] = '\0';
  filename[0x39] = '\0';
  filename[0x3a] = '\0';
  filename[0x3b] = '\0';
  filename[0x3c] = '\0';
  filename[0x3d] = '\0';
  filename[0x3e] = '\0';
  filename[0x3f] = '\0';
  filename[0x40] = '\0';
  filename[0x41] = '\0';
  filename[0x42] = '\0';
  filename[0x43] = '\0';
  filename[0x44] = '\0';
  filename[0x45] = '\0';
  filename[0x46] = '\0';
  filename[0x47] = '\0';
  filename[0x48] = '\0';
  filename[0x49] = '\0';
  filename[0x4a] = '\0';
  filename[0x4b] = '\0';
  filename[0x4c] = '\0';
  filename[0x4d] = '\0';
  filename[0x4e] = '\0';
  filename[0x4f] = '\0';
  filename[0x50] = '\0';
  filename[0x51] = '\0';
  filename[0x52] = '\0';
  filename[0x53] = '\0';
  filename[0x54] = '\0';
  filename[0x55] = '\0';
  filename[0x56] = '\0';
  filename[0x57] = '\0';
  filename[0x58] = '\0';
  filename[0x59] = '\0';
  filename[0x5a] = '\0';
  filename[0x5b] = '\0';
  filename[0x5c] = '\0';
  filename[0x5d] = '\0';
  filename[0x5e] = -0x10;
  filename[0x5f] = '?';
  filename[0x60] = '\0';
  filename[0x61] = '\0';
  filename[0x62] = '\0';
  filename[99] = '\0';
  filename[100] = '\0';
  filename[0x65] = '\0';
  filename[0x66] = '\0';
  filename[0x67] = '\0';
  filename[0x68] = '\0';
  filename[0x69] = '\0';
  filename[0x6a] = '\0';
  filename[0x6b] = '\0';
  filename[0x6c] = '\0';
  filename[0x6d] = '\0';
  filename[0x6e] = '\0';
  filename[0x6f] = '\0';
  filename[0x70] = '\0';
  filename[0x71] = '\0';
  filename[0x72] = '\0';
  filename[0x73] = '\0';
  filename[0x74] = '\0';
  filename[0x75] = '\0';
  filename[0x76] = '\0';
  filename[0x77] = '\0';
  filename[0x78] = '\0';
  filename[0x79] = '\0';
  filename[0x7a] = '\0';
  filename[0x7b] = '\0';
  filename[0x7c] = '\0';
  filename[0x7d] = '\0';
  filename[0x7e] = '\0';
  filename[0x7f] = '\0';
  filename[0x80] = '\0';
  filename[0x81] = '\0';
  filename[0x82] = '\0';
  filename[0x83] = '\0';
  filename[0x84] = '\0';
  filename[0x85] = '\0';
  filename[0x86] = -0x10;
  filename[0x87] = '?';
  filename[0x88] = '\0';
  filename[0x89] = '\0';
  filename[0x8a] = '\0';
  filename[0x8b] = '\0';
  filename[0x8c] = '\0';
  filename[0x8d] = '\0';
  filename[0x8e] = '\0';
  filename[0x8f] = '\0';
  filename[0x90] = '\0';
  filename[0x91] = '\0';
  filename[0x92] = '\0';
  filename[0x93] = '\0';
  filename[0x94] = '\0';
  filename[0x95] = '\0';
  filename[0x96] = '\0';
  filename[0x97] = '\0';
  filename[0x98] = '\0';
  filename[0x99] = '\0';
  filename[0x9a] = '\0';
  filename[0x9b] = '\0';
  filename[0x9c] = '\0';
  filename[0x9d] = '\0';
  filename[0x9e] = '\0';
  filename[0x9f] = '\0';
  filename[0xa0] = '\0';
  filename[0xa1] = '\0';
  filename[0xa2] = '\0';
  filename[0xa3] = '\0';
  filename[0xa4] = '\0';
  filename[0xa5] = '\0';
  filename[0xa6] = '\0';
  filename[0xa7] = '\0';
  filename[0xa8] = '\0';
  filename[0xa9] = '\0';
  filename[0xaa] = '\0';
  filename[0xab] = '\0';
  filename[0xac] = '\0';
  filename[0xad] = '\0';
  filename[0xae] = -0x10;
  filename[0xaf] = '?';
  filename._248_8_ = filename + 0xe8;
  filename[0xe8] = '\0';
  filename[0xe9] = '\0';
  filename[0xea] = '\0';
  filename[0xeb] = '\0';
  filename[0xf0] = '\0';
  filename[0xf1] = '\0';
  filename[0xf2] = '\0';
  filename[0xf3] = '\0';
  filename[0xf4] = '\0';
  filename[0xf5] = '\0';
  filename[0xf6] = '\0';
  filename[0xf7] = '\0';
  filename[0xd0] = '\0';
  filename[0xd1] = '\0';
  filename[0xd2] = '\0';
  filename[0xd3] = '\0';
  filename[0xd4] = '\0';
  filename[0xd5] = '\0';
  filename[0xd6] = '\0';
  filename[0xd7] = '\0';
  filename[0xd8] = '\0';
  filename[0xd9] = '\0';
  filename[0xda] = '\0';
  filename[0xdb] = '\0';
  filename[0xdc] = '\0';
  filename[0xdd] = '\0';
  filename[0xde] = '\0';
  filename[0xdf] = '\0';
  filename[0xc0] = '\0';
  filename[0xc1] = '\0';
  filename[0xc2] = '\0';
  filename[0xc3] = '\0';
  filename[0xc4] = '\0';
  filename[0xc5] = '\0';
  filename[0xc6] = '\0';
  filename[199] = '\0';
  filename[200] = '\0';
  filename[0xc9] = '\0';
  filename[0xca] = '\0';
  filename[0xcb] = '\0';
  filename[0xcc] = '\0';
  filename[0xcd] = '\0';
  filename[0xce] = '\0';
  filename[0xcf] = '\0';
  filename[0xb0] = '\0';
  filename[0xb1] = '\0';
  filename[0xb2] = '\0';
  filename[0xb3] = '\0';
  filename[0xb4] = '\0';
  filename[0xb5] = '\0';
  filename[0xb6] = '\0';
  filename[0xb7] = '\0';
  filename[0xb8] = '\0';
  filename[0xb9] = '\0';
  filename[0xba] = '\0';
  filename[0xbb] = '\0';
  filename[0xbc] = '\0';
  filename[0xbd] = '\0';
  filename[0xbe] = '\0';
  filename[0xbf] = '\0';
  local_300._M_left = &local_300;
  local_300._M_color = _S_red;
  local_300._M_parent = (_Base_ptr)0x0;
  local_2d8 = &this->settings;
  local_2e0 = 0;
  local_2b8._M_left = &local_2b8;
  local_2b8._M_color = _S_red;
  local_2b8._M_parent = (_Base_ptr)0x0;
  local_2d0 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  pvStack_2c8 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  local_298 = 0;
  lVar9 = 0;
  uVar29 = 0;
  filename._40_8_ = pScene;
  local_300._M_right = local_300._M_left;
  local_2b8._M_right = local_2b8._M_left;
  while( true ) {
    pIVar13 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                         (filename._32_8_ + 0x148));
    if ((ulong)(*(long *)&(pIVar13->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                          field_0x18 -
                *(long *)&(pIVar13->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                          field_0x10 >> 4) <= uVar29) break;
    pIVar13 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                         (filename._32_8_ + 0x148));
    anon_unknown.dwarf_9ee45f::ConvertUnit
              (*(DataType **)
                (*(long *)&(pIVar13->
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                           field_0x10 + lVar9),(ConversionData *)filename);
    uVar29 = uVar29 + 1;
    lVar9 = lVar9 + 0x10;
  }
  pLVar1 = *(Lazy **)(filename._32_8_ + 0x138);
  pIVar14 = (IfcRepresentationContext *)0x0;
  for (pLVar27 = *(Lazy **)(filename._32_8_ + 0x130); pLVar27 != pLVar1; pLVar27 = pLVar27 + 8) {
    pIVar14 = STEP::Lazy::operator_cast_to_IfcRepresentationContext_(pLVar27);
    if ((pIVar14->ContextType).have == true) {
      pbVar15 = STEP::
                Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(&pIVar14->ContextType);
      bVar6 = std::operator==(pbVar15,"Model");
      if (bVar6) goto LAB_00427593;
    }
  }
  if (pIVar14 != (IfcRepresentationContext *)0x0) {
LAB_00427593:
    pIVar16 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext>
                        ((Object *)
                         ((long)&(pIVar14->
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                 )._vptr_ObjectHelper +
                         (long)(pIVar14->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                               )._vptr_ObjectHelper[-3]));
    if (pIVar16 != (IfcGeometricRepresentationContext *)0x0) {
      Assimp::IFC::ConvertAxisPlacement
                ((IfcMatrix4 *)(filename + 0x30),
                 (pIVar16->WorldCoordinateSystem).
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(ConversionData *)filename);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4275cf);
    }
  }
  uVar4 = filename._24_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileInfo,"ifcsite",(allocator<char> *)&fileName);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             *)(uVar4 + 0x90);
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(this_00,(key_type *)&fileInfo);
  p_Var28 = (_Base_ptr)(uVar4 + 0x98);
  if (cVar17._M_node == p_Var28) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  std::__cxx11::string::~string((string *)&fileInfo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileInfo,"ifcsite",(allocator<char> *)&fileName);
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(this_00,(key_type *)&fileInfo);
  std::__cxx11::string::~string((string *)&fileInfo);
  if (cVar17._M_node[3]._M_parent == (_Base_ptr)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileInfo,"ifcbuilding",(allocator<char> *)&fileName);
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find(this_00,(key_type *)&fileInfo);
    if (cVar17._M_node == p_Var28) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    std::__cxx11::string::~string((string *)&fileInfo);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileInfo,"ifcbuilding",(allocator<char> *)&fileName);
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find(this_00,(key_type *)&fileInfo);
    std::__cxx11::string::~string((string *)&fileInfo);
    if (cVar17._M_node[3]._M_parent == (_Base_ptr)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileInfo,
                 "no root element found (expected IfcBuilding or preferably IfcSite)",
                 (allocator<char> *)&fileName);
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)&fileInfo);
      std::__cxx11::string::~string((string *)&fileInfo);
    }
  }
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pIVar22 = (IFCImporter *)cVar17._M_node[2]._M_right;
  while (pIVar22 != (IFCImporter *)&cVar17._M_node[2]._M_parent) {
    local_4e0 = pIVar22;
    paVar18 = (aiNode *)
              STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                        ((LazyObject *)
                         (pIVar22->super_BaseImporter).importerUnits._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left);
    if (paVar18 != (aiNode *)0x0) {
      if ((paVar18->mName).data[0x54] == '\x01') {
        pbVar15 = STEP::
                  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((paVar18->mName).data + 0x34));
        std::__cxx11::string::string((string *)&local_a0,(string *)pbVar15);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"unnamed",&local_4e9)
        ;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                     "looking at spatial structure `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,"`")
      ;
      if ((paVar18->mName).data[0xc4] == '\x01') {
        pbVar15 = STEP::
                  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((paVar18->mName).data + 0xa4));
        std::operator+(&local_c0," which is of type ",pbVar15);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_4ea);
      }
      std::operator+(&fileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_1,
                     &local_c0);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&fileInfo,
                 &fileName);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)&fileInfo);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileInfo);
      std::__cxx11::string::~string((string *)&fileName);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&temp_1);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::~string((string *)&local_a0);
      fileInfo.version =
           *(uLong *)(filename._32_8_ + 8 + *(long *)(*(long *)filename._32_8_ + -0x18));
      pVar30 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)(filename._24_8_ + 0xc0),&fileInfo.version);
      while (local_500 = pVar30.second._M_node, _Var21 = pVar30.first._M_node,
            _Var21._M_node != local_500._M_node) {
        pLVar12 = STEP::DB::GetObject((DB *)filename._24_8_,(uint64_t)_Var21._M_node[1]._M_parent);
        pIVar19 = STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelAggregates>(pLVar12);
        if (pIVar19 != (IfcRelAggregates *)0x0) {
          pLVar1 = *(Lazy **)&(pIVar19->super_IfcRelDecomposes).
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                              field_0x20;
          for (pLVar27 = *(Lazy **)&(pIVar19->super_IfcRelDecomposes).
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>
                                    .field_0x18; pLVar27 != pLVar1; pLVar27 = pLVar27 + 8) {
            pIVar20 = STEP::Lazy::operator_cast_to_IfcObjectDefinition_(pLVar27);
            if (*(long *)((long)&(pIVar20->super_IfcRoot).
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                 aux_is_derived.super__Base_bitset<1UL>._M_w +
                         (long)(pIVar20->super_IfcRoot).
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                               _vptr_ObjectHelper[-3]) ==
                *(long *)((paVar18->mName).data + *(long *)(*(long *)&paVar18->mName + -0x18) + 4))
            {
              LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x427968);
              fileInfo.version =
                   (uLong)anon_unknown.dwarf_9ee45f::ProcessSpatialStructure
                                    ((anon_unknown_dwarf_9ee45f *)0x0,paVar18,(IfcProduct *)filename
                                     ,(ConversionData *)0x0,in_R8);
              std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&nodes,(aiNode **)&fileInfo);
            }
          }
        }
        _Var21._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var21._M_node);
        pVar30.second._M_node = local_500._M_node;
        pVar30.first._M_node = _Var21._M_node;
      }
    }
    pIVar22 = (IFCImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_4e0);
  }
  lVar9 = (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4279e3);
    for (p_Var23 = cVar17._M_node[2]._M_right; p_Var23 != (_Base_ptr)&cVar17._M_node[2]._M_parent;
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
      paVar18 = (aiNode *)
                STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                          (*(LazyObject **)(p_Var23 + 1));
      if (paVar18 != (aiNode *)0x0) {
        fileInfo.version =
             (uLong)anon_unknown.dwarf_9ee45f::ProcessSpatialStructure
                              ((anon_unknown_dwarf_9ee45f *)0x0,paVar18,(IfcProduct *)filename,
                               (ConversionData *)0x0,in_R8);
        std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&nodes,(aiNode **)&fileInfo);
      }
    }
    lVar9 = (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  lVar9 = lVar9 >> 3;
  if (lVar9 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileInfo,"failed to determine primary site element",
               (allocator<char> *)&fileName);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)&fileInfo);
    std::__cxx11::string::~string((string *)&fileInfo);
  }
  else if (lVar9 == 1) {
    *(aiNode **)(filename._40_8_ + 8) =
         *nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  else {
    paVar18 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileInfo,"Root",(allocator<char> *)&fileName);
    aiNode::aiNode(paVar18,(string *)&fileInfo);
    *(aiNode **)(filename._40_8_ + 8) = paVar18;
    std::__cxx11::string::~string((string *)&fileInfo);
    *(undefined8 *)(*(long *)(filename._40_8_ + 8) + 0x448) = 0;
    *(int *)(*(long *)(filename._40_8_ + 8) + 0x450) = (int)lVar9;
    lVar10 = *(long *)(filename._40_8_ + 8);
    pvVar24 = operator_new__((ulong)*(uint *)(lVar10 + 0x450) << 3);
    *(void **)(lVar10 + 0x458) = pvVar24;
    for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
      paVar18 = nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
      paVar2 = *(aiNode **)(filename._40_8_ + 8);
      paVar18->mParent = paVar2;
      paVar2->mChildren[lVar10] = paVar18;
    }
  }
  std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
            (&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
  paVar18 = *(aiNode **)(filename._40_8_ + 8);
  fileInfo.version = 0x3ff0000000000000;
  fileInfo.version_needed = 0;
  fileInfo.flag = 0;
  fileInfo.compression_method = 0;
  fileInfo.dosDate = 0;
  fileInfo.crc = 0x3ff0000000000000;
  fileInfo.compressed_size = 0;
  fileInfo.uncompressed_size = 0;
  fileInfo.size_filename = 0;
  fileInfo.size_file_extra = 0;
  fileInfo.size_file_comment = 0x3ff0000000000000;
  fileInfo.disk_num_start = 0;
  fileInfo.internal_fa = 0;
  fileInfo.external_fa = 0;
  fileInfo.tmu_date.tm_sec = 0;
  fileInfo.tmu_date.tm_min = 0;
  fileInfo.tmu_date.tm_hour = 0;
  fileInfo.tmu_date.tm_mday = 0x3ff00000;
  aiMatrix4x4t::operator_cast_to_aiMatrix4x4t((aiMatrix4x4t<double> *)&fileInfo);
  anon_unknown.dwarf_9ee45f::MakeTreeRelative(paVar18,(aiMatrix4x4 *)&fileName);
  uVar4 = filename._176_8_;
  uVar29 = filename._184_8_ - filename._176_8_;
  if (uVar29 != 0) {
    local_4e8->mNumMeshes = (uint)(uVar29 >> 3);
    __s = (aiMesh **)operator_new__(uVar29 & 0x7fffffff8);
    memset(__s,0,uVar29 & 0x7fffffff8);
    local_4e8->mMeshes = __s;
    memmove(__s,(void *)uVar4,uVar29);
    uVar5 = filename._176_8_;
    filename[0xb0] = (char)uVar4;
    filename[0xb1] = SUB81(uVar4,1);
    filename[0xb2] = SUB81(uVar4,2);
    filename[0xb3] = SUB81(uVar4,3);
    filename[0xb4] = SUB81(uVar4,4);
    filename[0xb5] = SUB81(uVar4,5);
    filename[0xb6] = SUB81(uVar4,6);
    filename[0xb7] = SUB81(uVar4,7);
    filename[0xb8] = filename[0xb0];
    filename[0xb9] = filename[0xb1];
    filename[0xba] = filename[0xb2];
    filename[0xbb] = filename[0xb3];
    filename[0xbc] = filename[0xb4];
    filename[0xbd] = filename[0xb5];
    filename[0xbe] = filename[0xb6];
    filename[0xbf] = filename[0xb7];
    filename._176_8_ = uVar5;
  }
  uVar4 = filename._200_8_;
  uVar29 = filename._208_8_ - filename._200_8_;
  paVar26 = local_4e8;
  if (uVar29 != 0) {
    local_4e8->mNumMaterials = (uint)(uVar29 >> 3);
    __s_00 = (aiMaterial **)operator_new__(uVar29 & 0x7fffffff8);
    memset(__s_00,0,uVar29 & 0x7fffffff8);
    paVar26 = local_4e8;
    local_4e8->mMaterials = __s_00;
    memmove(__s_00,(void *)uVar4,uVar29);
    uVar5 = filename._200_8_;
    filename[200] = (char)uVar4;
    filename[0xc9] = SUB81(uVar4,1);
    filename[0xca] = SUB81(uVar4,2);
    filename[0xcb] = SUB81(uVar4,3);
    filename[0xcc] = SUB81(uVar4,4);
    filename[0xcd] = SUB81(uVar4,5);
    filename[0xce] = SUB81(uVar4,6);
    filename[0xcf] = SUB81(uVar4,7);
    filename[0xd0] = filename[200];
    filename[0xd1] = filename[0xc9];
    filename[0xd2] = filename[0xca];
    filename[0xd3] = filename[0xcb];
    filename[0xd4] = filename[0xcc];
    filename[0xd5] = filename[0xcd];
    filename[0xd6] = filename[0xce];
    filename[0xd7] = filename[0xcf];
    filename._200_8_ = uVar5;
  }
  fileName._M_dataplus._M_p._0_4_ = (float)(double)filename._0_8_;
  fileName._4_8_ = 0;
  fileName._12_8_ = 0;
  fileName.field_2._8_8_ = 0;
  temp.a1 = 1.0;
  temp.a2 = 0.0;
  temp.a3 = 0.0;
  temp.a4 = 0.0;
  temp.b1 = 0.0;
  temp.b2 = -4.371139e-08;
  temp.b3 = 1.0;
  temp.b4 = 0.0;
  temp.c1 = 0.0;
  temp.c2 = -1.0;
  temp.c3 = -4.371139e-08;
  temp.c4 = 0.0;
  temp.d1 = 0.0;
  temp.d2 = 0.0;
  temp.d3 = 0.0;
  temp.d4 = 1.0;
  fileName.field_2._M_allocated_capacity._4_4_ = fileName._M_dataplus._M_p._0_4_;
  aiMatrix4x4t<float>::operator*=(&temp,(aiMatrix4x4t<float> *)&fileName);
  aiMatrix4x4t::operator_cast_to_aiMatrix4x4t((aiMatrix4x4t<double> *)(filename + 0x30));
  temp_1.a2 = temp.a2;
  temp_1.a1 = temp.a1;
  temp_1.a4 = temp.a4;
  temp_1.a3 = temp.a3;
  temp_1.b2 = temp.b2;
  temp_1.b1 = temp.b1;
  temp_1.b4 = temp.b4;
  temp_1.b3 = temp.b3;
  temp_1.c2 = temp.c2;
  temp_1.c1 = temp.c1;
  temp_1.c4 = temp.c4;
  temp_1.c3 = temp.c3;
  temp_1.d2 = temp.d2;
  temp_1.d1 = temp.d1;
  temp_1.d4 = temp.d4;
  temp_1.d3 = temp.d3;
  aiMatrix4x4t<float>::operator*=(&temp_1,&local_a0);
  fileInfo.compressed_size._0_4_ = temp_1.d1;
  fileInfo.compressed_size._4_4_ = temp_1.d2;
  fileInfo.uncompressed_size._0_4_ = temp_1.d3;
  fileInfo.uncompressed_size._4_4_ = temp_1.d4;
  fileInfo.dosDate._0_4_ = temp_1.c1;
  fileInfo.dosDate._4_4_ = temp_1.c2;
  fileInfo.crc._0_4_ = temp_1.c3;
  fileInfo.crc._4_4_ = temp_1.c4;
  fileInfo.flag._0_4_ = temp_1.b1;
  fileInfo.flag._4_4_ = temp_1.b2;
  fileInfo.compression_method._0_4_ = temp_1.b3;
  fileInfo.compression_method._4_4_ = temp_1.b4;
  fileInfo.version._0_4_ = temp_1.a1;
  fileInfo.version._4_4_ = temp_1.a2;
  fileInfo.version_needed._0_4_ = temp_1.a3;
  fileInfo.version_needed._4_4_ = temp_1.a4;
  aiMatrix4x4t<float>::operator*=
            ((aiMatrix4x4t<float> *)&fileInfo,&paVar26->mRootNode->mTransformation);
  paVar18 = paVar26->mRootNode;
  (paVar18->mTransformation).d1 = (float)(undefined4)fileInfo.compressed_size;
  (paVar18->mTransformation).d2 = (float)fileInfo.compressed_size._4_4_;
  (paVar18->mTransformation).d3 = (float)(undefined4)fileInfo.uncompressed_size;
  (paVar18->mTransformation).d4 = (float)fileInfo.uncompressed_size._4_4_;
  (paVar18->mTransformation).c1 = (float)(undefined4)fileInfo.dosDate;
  (paVar18->mTransformation).c2 = (float)fileInfo.dosDate._4_4_;
  (paVar18->mTransformation).c3 = (float)(undefined4)fileInfo.crc;
  (paVar18->mTransformation).c4 = (float)fileInfo.crc._4_4_;
  (paVar18->mTransformation).b1 = (float)(undefined4)fileInfo.flag;
  (paVar18->mTransformation).b2 = (float)fileInfo.flag._4_4_;
  (paVar18->mTransformation).b3 = (float)(undefined4)fileInfo.compression_method;
  (paVar18->mTransformation).b4 = (float)fileInfo.compression_method._4_4_;
  (paVar18->mTransformation).a1 = (float)(undefined4)fileInfo.version;
  (paVar18->mTransformation).a2 = (float)fileInfo.version._4_4_;
  (paVar18->mTransformation).a3 = (float)(undefined4)fileInfo.version_needed;
  (paVar18->mTransformation).a4 = (float)fileInfo.version_needed._4_4_;
  bVar6 = DefaultLogger::isNullLogger();
  if (!bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileInfo);
    std::operator<<((ostream *)&fileInfo,"STEP: evaluated ");
    std::ostream::_M_insert<unsigned_long>((ulong)&fileInfo);
    std::operator<<((ostream *)&fileInfo," object records");
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)&fileInfo);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileInfo);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)filename);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)&schema);
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr(&db);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}